

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen-x86_64.c
# Opt level: O0

void target_get_early_clobbered_hard_regs(MIR_insn_t insn,MIR_reg_t *hr1,MIR_reg_t *hr2)

{
  int iVar1;
  MIR_insn_code_t code;
  MIR_reg_t *hr2_local;
  MIR_reg_t *hr1_local;
  MIR_insn_t insn_local;
  
  iVar1 = (int)*(undefined8 *)&insn->field_0x18;
  *hr2 = 0xffffffff;
  *hr1 = 0xffffffff;
  if ((((((iVar1 == 0x31) || (iVar1 == 0x33)) || (iVar1 == 0x32)) ||
       ((iVar1 == 0x34 || (iVar1 == 0x38)))) || (iVar1 == 0x3a)) ||
     (((iVar1 == 0x39 || (iVar1 == 0x3b)) || ((iVar1 == 0x74 || (iVar1 == 0x75)))))) {
    *hr1 = 2;
  }
  else if ((((iVar1 == 0x4a) || (iVar1 == 0x4f)) || (iVar1 == 0x4b)) ||
          (((iVar1 == 0x50 || (iVar1 == 0x4c)) || (iVar1 == 0x51)))) {
    *hr1 = 0;
    *hr2 = 2;
  }
  else if (((((iVar1 == 0x56) || (iVar1 == 0x5d)) ||
            ((iVar1 == 100 || (((iVar1 == 0x6b || (iVar1 == 0x57)) || (iVar1 == 0x5e)))))) ||
           ((iVar1 == 0x65 || (iVar1 == 0x6c)))) ||
          ((iVar1 == 0x58 || (((iVar1 == 0x5f || (iVar1 == 0x66)) || (iVar1 == 0x6d)))))) {
    *hr1 = 0;
  }
  return;
}

Assistant:

static void target_get_early_clobbered_hard_regs (MIR_insn_t insn, MIR_reg_t *hr1, MIR_reg_t *hr2) {
  MIR_insn_code_t code = insn->code;

  *hr1 = *hr2 = MIR_NON_VAR;
  if (code == MIR_DIV || code == MIR_UDIV || code == MIR_DIVS || code == MIR_UDIVS
      || code == MIR_MOD || code == MIR_UMOD || code == MIR_MODS || code == MIR_UMODS
      || code == MIR_UMULO || code == MIR_UMULOS) {
    *hr1 = DX_HARD_REG;
  } else if (code == MIR_FEQ || code == MIR_FNE || code == MIR_DEQ || code == MIR_DNE
             || code == MIR_LDEQ || code == MIR_LDNE) {
    *hr1 = AX_HARD_REG;
    *hr2 = DX_HARD_REG;
  } else if (code == MIR_FLT || code == MIR_FLE || code == MIR_FGT || code == MIR_FGE
             || code == MIR_DLT || code == MIR_DLE || code == MIR_DGT || code == MIR_DGE
             || code == MIR_LDLT || code == MIR_LDLE || code == MIR_LDGT || code == MIR_LDGE) {
    *hr1 = AX_HARD_REG;
  }
}